

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O1

int loader_impl_function_hook_call(context ctx,char *func_name)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  void *null_args [1];
  undefined8 local_18;
  
  uVar2 = context_scope();
  lVar3 = scope_get(uVar2,func_name);
  if (lVar3 == 0) {
    lVar3 = 0;
  }
  else {
    lVar3 = value_to_function(lVar3);
  }
  if (lVar3 != 0) {
    local_18 = 0;
    lVar3 = function_call(lVar3,&local_18,0);
    if (lVar3 != 0) {
      iVar1 = value_to_int(lVar3);
      value_destroy(lVar3);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int loader_impl_function_hook_call(context ctx, const char func_name[])
{
	scope sp = context_scope(ctx);

	value val = scope_get(sp, func_name);

	function func_init = NULL;

	if (val != NULL)
	{
		func_init = value_to_function(val);
	}

	if (func_init != NULL)
	{
		void *null_args[1] = { NULL };

		function_return ret = function_call(func_init, null_args, 0);

		if (ret != NULL)
		{
			int result = value_to_int(ret);

			value_destroy(ret);

			return result;
		}
	}

	return 0;
}